

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBlif.c
# Opt level: O2

void Io_NtkWriteConvertedBox(FILE *pFile,Abc_Ntk_t *pNtk,int fSeq)

{
  Abc_Obj_t *pAVar1;
  char *pcVar2;
  char *pcVar3;
  int i;
  size_t __size;
  char *pcVar4;
  int iVar5;
  
  if (fSeq == 0) {
    fwrite(".attrib white box comb\n",0x17,1,(FILE *)pFile);
    pcVar4 = ".delay 1\n";
    __size = 9;
  }
  else {
    pcVar4 = ".attrib white box seq\n";
    __size = 0x16;
  }
  fwrite(pcVar4,__size,1,(FILE *)pFile);
  pcVar4 = " %s_in\n";
  if (fSeq == 0) {
    pcVar4 = " %s\n";
  }
  for (i = 0; i < pNtk->vPos->nSize; i = i + 1) {
    pAVar1 = Abc_NtkPo(pNtk,i);
    fwrite(".names",6,1,(FILE *)pFile);
    Io_NtkWritePis(pFile,pNtk,1);
    pcVar2 = Abc_ObjName((Abc_Obj_t *)pAVar1->pNtk->vObjs->pArray[*(pAVar1->vFanins).pArray]);
    fprintf((FILE *)pFile,pcVar4,pcVar2);
    for (iVar5 = 0; iVar5 < pNtk->vPis->nSize; iVar5 = iVar5 + 1) {
      fputc(0x31,(FILE *)pFile);
    }
    fwrite(" 1\n",3,1,(FILE *)pFile);
    if (fSeq != 0) {
      pcVar2 = Abc_ObjName((Abc_Obj_t *)pAVar1->pNtk->vObjs->pArray[*(pAVar1->vFanins).pArray]);
      pcVar3 = Abc_ObjName((Abc_Obj_t *)pAVar1->pNtk->vObjs->pArray[*(pAVar1->vFanins).pArray]);
      fprintf((FILE *)pFile,".latch %s_in %s 1\n",pcVar2,pcVar3);
    }
  }
  return;
}

Assistant:

void Io_NtkWriteConvertedBox( FILE * pFile, Abc_Ntk_t * pNtk, int fSeq )
{
    Abc_Obj_t * pObj;
    int i, v;
    if ( fSeq )
    {
        fprintf( pFile, ".attrib white box seq\n" );
    }
    else
    {
        fprintf( pFile, ".attrib white box comb\n" );
        fprintf( pFile, ".delay 1\n" );
    }
    Abc_NtkForEachPo( pNtk, pObj, i )
    { 
        // write the .names line
        fprintf( pFile, ".names" );
        Io_NtkWritePis( pFile, pNtk, 1 );
        if ( fSeq )
            fprintf( pFile, " %s_in\n", Abc_ObjName(Abc_ObjFanin0(pObj)) );
        else
            fprintf( pFile, " %s\n", Abc_ObjName(Abc_ObjFanin0(pObj)) );
        for ( v = 0; v < Abc_NtkPiNum(pNtk); v++ )
            fprintf( pFile, "1" );
        fprintf( pFile, " 1\n" );
        if ( fSeq )
            fprintf( pFile, ".latch %s_in %s 1\n", Abc_ObjName(Abc_ObjFanin0(pObj)), Abc_ObjName(Abc_ObjFanin0(pObj)) );
    }
}